

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void SplitRGBRow_C(uint8_t *src_rgb,uint8_t *dst_r,uint8_t *dst_g,uint8_t *dst_b,int width)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)width;
  if (width < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    dst_r[uVar1] = *src_rgb;
    dst_g[uVar1] = src_rgb[1];
    dst_b[uVar1] = src_rgb[2];
    src_rgb = src_rgb + 3;
  }
  return;
}

Assistant:

void SplitRGBRow_C(const uint8_t* src_rgb,
                   uint8_t* dst_r,
                   uint8_t* dst_g,
                   uint8_t* dst_b,
                   int width) {
  int x;
  for (x = 0; x < width; ++x) {
    dst_r[x] = src_rgb[0];
    dst_g[x] = src_rgb[1];
    dst_b[x] = src_rgb[2];
    src_rgb += 3;
  }
}